

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_consume.c
# Opt level: O0

int mpt_iterator_consume(mpt_iterator *it,mpt_type_t type,void *dest)

{
  mpt_type_t mVar1;
  int iVar2;
  mpt_value *val_00;
  size_t *local_88;
  size_t sStack_60;
  int ret;
  size_t len;
  uint8_t tmp [32];
  mpt_value *val;
  void *dest_local;
  mpt_type_t type_local;
  mpt_iterator *it_local;
  
  val_00 = (*it->_vptr->value)(it);
  if (type == 0) {
    dest_local._0_4_ = 0;
    if ((val_00 != (mpt_value *)0x0) && (val_00->_type < 0x1000)) {
      dest_local._0_4_ = (uint)val_00->_type;
    }
    it_local._4_4_ = (*it->_vptr->advance)(it);
    if (-1 < (int)it_local._4_4_) {
      it_local._4_4_ = (uint)dest_local;
    }
  }
  else if (val_00 == (mpt_value *)0x0) {
    it_local._4_4_ = 0xfffffff0;
  }
  else {
    switch(type) {
    case 0x62:
      sStack_60 = 1;
      break;
    case 99:
      sStack_60 = 1;
      break;
    case 100:
      sStack_60 = 8;
      break;
    case 0x65:
      sStack_60 = 0x10;
      break;
    case 0x66:
      sStack_60 = 4;
      break;
    default:
      return -3;
    case 0x69:
      sStack_60 = 4;
      break;
    case 0x6c:
      sStack_60 = 8;
      break;
    case 0x6e:
      sStack_60 = 2;
      break;
    case 0x71:
      sStack_60 = 2;
      break;
    case 0x74:
      sStack_60 = 8;
      break;
    case 0x75:
      sStack_60 = 4;
      break;
    case 0x78:
      sStack_60 = 8;
      break;
    case 0x79:
      sStack_60 = 1;
    }
    if (dest == (void *)0x0) {
      local_88 = (size_t *)0x0;
    }
    else {
      local_88 = &len;
    }
    it_local._4_4_ = mpt_value_convert(val_00,type,local_88);
    if (-1 < (int)it_local._4_4_) {
      mVar1 = val_00->_type;
      iVar2 = (*it->_vptr->advance)(it);
      it_local._4_4_ = (uint)(iVar2 < 0);
      if (iVar2 >= 0) {
        if (dest != (void *)0x0) {
          memcpy(dest,&len,sStack_60);
        }
        it_local._4_4_ = (uint)mVar1;
      }
    }
  }
  return it_local._4_4_;
}

Assistant:

extern int mpt_iterator_consume(MPT_INTERFACE(iterator) *it, MPT_TYPE(type) type, void *dest)
{
	const MPT_STRUCT(value) *val = it->_vptr->value(it);
	uint8_t tmp[32];
	size_t len;
	int ret;
	
	/* skip current value */
	if (!type) {
		if (val && (val->_type <= MPT_ENUM(_TypeValueMax))) {
			type = val->_type;
		}
		if ((ret = it->_vptr->advance(it)) < 0) {
			return ret;
		}
		return type;
	}
	/* no data to work with */
	if (!val) {
		return MPT_ERROR(MissingData);
	}
	/* limit options to known self-sufficent types */
	switch (type) {
		case 'c': len = sizeof(char); break;
		case 'b': len = sizeof(int8_t); break;
		case 'y': len = sizeof(uint8_t); break;
		case 'n': len = sizeof(int16_t); break;
		case 'q': len = sizeof(uint16_t); break;
		case 'i': len = sizeof(int32_t); break;
		case 'u': len = sizeof(uint32_t); break;
		case 'x': len = sizeof(int64_t); break;
		case 't': len = sizeof(uint64_t); break;
		
		case 'l': len = sizeof(long); break;
		
		case 'f': len = sizeof(float); break;
		case 'd': len = sizeof(double); break;
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e': len = sizeof(long double); break;
#endif
		default: return MPT_ERROR(BadType);
	}
	if ((ret = mpt_value_convert(val, type, dest ? tmp : 0)) < 0) {
		return ret;
	}
	/* save origin type, iterator advance invalidates value pointer */
	type = val->_type;
	if ((ret = it->_vptr->advance(it) < 0)) {
		return ret;
	}
	if (dest) {
		memcpy(dest, tmp, len);
	}
	return type;
}